

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

void makeFullFilename(char *path,char *name,char *filename,int32_t capacity)

{
  size_t sVar1;
  char *__dest;
  
  __dest = filename;
  if ((path != (char *)0x0) && (*path != '\0')) {
    sVar1 = strlen(path);
    if (0x3ff < (int)sVar1 + 1) {
      fprintf(_stderr,"pathname too long: \"%s\"\n",path);
      goto LAB_001ef0a7;
    }
    strcpy(filename,path);
    sVar1 = strlen(filename);
    __dest = filename + sVar1;
    if (filename[sVar1 - 1] != '/') {
      *__dest = '/';
      __dest = __dest + 1;
    }
  }
  sVar1 = strlen(name);
  if ((int)sVar1 + ((int)__dest - (int)filename) < 0x400) {
    strcpy(__dest,name);
    return;
  }
  fprintf(_stderr,"path/filename too long: \"%s%s\"\n",filename,name);
LAB_001ef0a7:
  exit(0xf);
}

Assistant:

static void
makeFullFilename(const char *path, const char *name,
                 char *filename, int32_t capacity) {
    char *s;

    // prepend the path unless NULL or empty
    if(path!=NULL && path[0]!=0) {
        if((int32_t)(strlen(path)+1)>=capacity) {
            fprintf(stderr, "pathname too long: \"%s\"\n", path);
            exit(U_BUFFER_OVERFLOW_ERROR);
        }
        strcpy(filename, path);

        // make sure the path ends with a file separator
        s=strchr(filename, 0);
        if(*(s-1)!=U_FILE_SEP_CHAR && *(s-1)!=U_FILE_ALT_SEP_CHAR) {
            *s++=U_FILE_SEP_CHAR;
        }
    } else {
        s=filename;
    }

    // turn the name into a filename, turn tree separators into file separators
    if((int32_t)((s-filename)+strlen(name))>=capacity) {
        fprintf(stderr, "path/filename too long: \"%s%s\"\n", filename, name);
        exit(U_BUFFER_OVERFLOW_ERROR);
    }
    strcpy(s, name);
    treeToPath(s);
}